

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  bool bVar1;
  byte in_DL;
  ImVec2 *in_RSI;
  ImVec2 *in_RDI;
  ImRect rect_for_touch;
  ImRect rect_clipped;
  ImGuiContext *g;
  ImVec2 in_stack_ffffffffffffffa8;
  ImVec2 local_50;
  ImVec2 in_stack_ffffffffffffffb8;
  ImVec2 in_stack_ffffffffffffffc0;
  ImRect local_38;
  ImGuiContext *local_28;
  byte local_19;
  
  local_19 = in_DL & 1;
  local_28 = GImGui;
  ImRect::ImRect(&local_38,in_RDI,in_RSI);
  if ((local_19 & 1) != 0) {
    ImRect::ClipWith((ImRect *)in_stack_ffffffffffffffc0,(ImRect *)in_stack_ffffffffffffffb8);
  }
  local_50 = operator-((ImVec2 *)in_stack_ffffffffffffffa8,(ImVec2 *)0x178170);
  operator+((ImVec2 *)in_stack_ffffffffffffffa8,(ImVec2 *)0x17818c);
  ImRect::ImRect((ImRect *)&stack0xffffffffffffffb8,&local_50,(ImVec2 *)&stack0xffffffffffffffa8);
  bVar1 = ImRect::Contains((ImRect *)&stack0xffffffffffffffb8,&(local_28->IO).MousePos);
  return bVar1;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.ClipWith(g.CurrentWindow->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    if (!rect_for_touch.Contains(g.IO.MousePos))
        return false;
    return true;
}